

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  TokenQueue *this_00;
  Location loc;
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  ulong uVar4;
  Token *pTVar5;
  ulong uVar6;
  optional<wabt::Token> *poVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  TokenType TVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view __x;
  Token cur;
  Token local_b0;
  Token local_70;
  
  if (1 < n) {
    __assert_fail("n <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0x239,"TokenType wabt::WastParser::Peek(size_t)");
  }
  this_00 = &this->tokens_;
LAB_0017cbe8:
  do {
    sVar2 = TokenQueue::size(this_00);
    if (n < sVar2) {
      pTVar5 = TokenQueue::at(this_00,n);
      return pTVar5->token_type_;
    }
    WastLexer::GetToken(&cur,this->lexer_);
    if (cur.token_type_ == LparAnn) {
      if (this->options_[0xb] == (WastParseOptions)0x0) {
        Token::to_string_abi_cxx11_((string *)&local_b0,&cur);
        Error(this,0x1e1873,(char *)local_b0.loc.filename._M_len);
        std::__cxx11::string::_M_dispose();
        loc.filename._M_str._0_4_ = (int)cur.loc.filename._M_str;
        loc.filename._M_len = cur.loc.filename._M_len;
        loc.filename._M_str._4_4_ = (int)((ulong)cur.loc.filename._M_str >> 0x20);
        loc.field_1.field_0.line = cur.loc.field_1._0_4_;
        loc.field_1.field_0.first_column = cur.loc.field_1._4_4_;
        loc.field_1.field_0.last_column = (int)cur.loc.field_1._8_8_;
        loc.field_1._12_4_ = (int)((ulong)cur.loc.field_1._8_8_ >> 0x20);
        Token::Token(&local_70,loc,First);
        uVar6 = (ulong)(this->tokens_).i;
        uVar4 = uVar6 ^ 1;
        if ((this->tokens_).tokens._M_elems[uVar4].super__Optional_base<wabt::Token,_true,_true>.
            _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == true)
        goto LAB_0017ce94;
        poVar7 = (this_00->tokens)._M_elems + uVar4;
        uVar9 = (undefined4)local_70.loc.filename._M_len;
        uVar10 = local_70.loc.filename._M_len._4_4_;
        uVar11 = local_70.loc.filename._M_str._0_4_;
        uVar12 = local_70.loc.filename._M_str._4_4_;
        uVar13 = local_70.loc.field_1.field_0.line;
        uVar14 = local_70.loc.field_1.field_0.first_column;
        uVar15 = local_70.loc.field_1.field_0.last_column;
        uVar16 = local_70.loc.field_1._12_4_;
        TVar17 = local_70.token_type_;
        uVar18 = local_70._36_4_;
        uVar19 = local_70.field_2.type_.enum_;
        uVar20 = local_70.field_2.type_.type_index_;
        uVar21 = local_70.field_2.literal_.text._M_len._0_4_;
        uVar22 = local_70.field_2.literal_.text._M_len._4_4_;
        uVar23 = local_70.field_2._16_4_;
        uVar24 = local_70.field_2._20_4_;
      }
      else {
        if (this->options_[0xc] == (WastParseOptions)0x1) {
          local_b0.loc.filename = Token::text(&cur);
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_b0,
                             "metadata.code.",0);
          if (sVar3 != 0) goto LAB_0017cc54;
        }
        else {
LAB_0017cc54:
          __x = Token::text(&cur);
          __y._M_str = "custom";
          __y._M_len = 6;
          bVar1 = std::operator==(__x,__y);
          if (!bVar1) {
            iVar8 = 1;
LAB_0017cdd9:
            do {
              if (iVar8 < 1) goto LAB_0017cbe8;
              WastLexer::GetToken(&local_b0,this->lexer_);
              cur.loc.filename._M_len = local_b0.loc.filename._M_len;
              cur.loc.filename._M_str = local_b0.loc.filename._M_str;
              cur.loc.field_1.field_1.offset = local_b0.loc.field_1.field_1.offset;
              cur.loc.field_1._8_8_ = local_b0.loc.field_1._8_8_;
              cur.token_type_ = local_b0.token_type_;
              cur._36_4_ = local_b0._36_4_;
              cur.field_2.type_.enum_ = local_b0.field_2.type_.enum_;
              cur.field_2.type_.type_index_ = local_b0.field_2.type_.type_index_;
              cur.field_2.literal_.text._M_len._0_4_ = local_b0.field_2.literal_.text._M_len._0_4_;
              cur.field_2.literal_.text._M_len._4_4_ = local_b0.field_2.literal_.text._M_len._4_4_;
              cur.field_2._16_4_ = local_b0.field_2._16_4_;
              cur.field_2._20_4_ = local_b0.field_2._20_4_;
              if (local_b0.token_type_ != Eof) {
                if (local_b0.token_type_ != LparAnn) {
                  if (local_b0.token_type_ == Rpar) {
                    iVar8 = iVar8 + -1;
                    goto LAB_0017cdd9;
                  }
                  if (local_b0.token_type_ != Lpar) goto LAB_0017cdd9;
                }
                iVar8 = iVar8 + 1;
                goto LAB_0017cdd9;
              }
              iVar8 = 0;
              Error(this,0x1e188f);
            } while( true );
          }
        }
        uVar6 = (ulong)(this->tokens_).i;
        uVar4 = uVar6 ^ 1;
        if ((this->tokens_).tokens._M_elems[uVar4].super__Optional_base<wabt::Token,_true,_true>.
            _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == true) {
LAB_0017ce94:
          __assert_fail("!tokens[!i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                        ,0xf1b,"void wabt::WastParser::TokenQueue::push_back(Token)");
        }
        poVar7 = (this_00->tokens)._M_elems + uVar4;
        uVar9 = (undefined4)cur.loc.filename._M_len;
        uVar10 = cur.loc.filename._M_len._4_4_;
        uVar11 = cur.loc.filename._M_str._0_4_;
        uVar12 = cur.loc.filename._M_str._4_4_;
        uVar13 = cur.loc.field_1.field_0.line;
        uVar14 = cur.loc.field_1.field_0.first_column;
        uVar15 = cur.loc.field_1.field_0.last_column;
        uVar16 = cur.loc.field_1._12_4_;
        TVar17 = cur.token_type_;
        uVar18 = cur._36_4_;
        uVar19 = cur.field_2.type_.enum_;
        uVar20 = cur.field_2.type_.type_index_;
        uVar21 = cur.field_2.literal_.text._M_len._0_4_;
        uVar22 = cur.field_2.literal_.text._M_len._4_4_;
        uVar23 = cur.field_2._16_4_;
        uVar24 = cur.field_2._20_4_;
      }
    }
    else {
      uVar6 = (ulong)(this->tokens_).i;
      uVar4 = uVar6 ^ 1;
      if ((this->tokens_).tokens._M_elems[uVar4].super__Optional_base<wabt::Token,_true,_true>.
          _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == true)
      goto LAB_0017ce94;
      poVar7 = (this_00->tokens)._M_elems + uVar4;
      uVar9 = (undefined4)cur.loc.filename._M_len;
      uVar10 = cur.loc.filename._M_len._4_4_;
      uVar11 = cur.loc.filename._M_str._0_4_;
      uVar12 = cur.loc.filename._M_str._4_4_;
      uVar13 = cur.loc.field_1.field_0.line;
      uVar14 = cur.loc.field_1.field_0.first_column;
      uVar15 = cur.loc.field_1.field_0.last_column;
      uVar16 = cur.loc.field_1._12_4_;
      TVar17 = cur.token_type_;
      uVar18 = cur._36_4_;
      uVar19 = cur.field_2.type_.enum_;
      uVar20 = cur.field_2.type_.type_index_;
      uVar21 = cur.field_2.literal_.text._M_len._0_4_;
      uVar22 = cur.field_2.literal_.text._M_len._4_4_;
      uVar23 = cur.field_2._16_4_;
      uVar24 = cur.field_2._20_4_;
    }
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x30) = uVar21;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x34) = uVar22;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x38) = uVar23;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x3c) = uVar24;
    (poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
    super__Optional_payload_base<wabt::Token>._M_payload._M_value.token_type_ = TVar17;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x24) = uVar18;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x28) = uVar19;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x2c) = uVar20;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x10) = uVar13;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x14) = uVar14;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x18) = uVar15;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0x1c) = uVar16;
    *(undefined4 *)
     &(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
      super__Optional_payload_base<wabt::Token>._M_payload = uVar9;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 4) = uVar10;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 8) = uVar11;
    *(undefined4 *)
     ((long)&(poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
             super__Optional_payload_base<wabt::Token>._M_payload + 0xc) = uVar12;
    (poVar7->super__Optional_base<wabt::Token,_true,_true>)._M_payload.
    super__Optional_payload_base<wabt::Token>._M_engaged = true;
    if ((this->tokens_).tokens._M_elems[uVar6].super__Optional_base<wabt::Token,_true,_true>.
        _M_payload.super__Optional_payload_base<wabt::Token>._M_engaged == false) {
      (this->tokens_).i = SUB81(uVar4,0);
    }
  } while( true );
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  assert(n <= 1);
  while (tokens_.size() <= n) {
    Token cur = lexer_->GetToken();
    if (cur.token_type() != TokenType::LparAnn) {
      tokens_.push_back(cur);
    } else {
      // Custom annotation. For now, discard until matching Rpar, unless it is
      // a code metadata annotation or custom section. In those cases, we know
      // how to parse it.
      if (!options_->features.annotations_enabled()) {
        Error(cur.loc, "annotations not enabled: %s", cur.to_string().c_str());
        tokens_.push_back(Token(cur.loc, TokenType::Invalid));
        continue;
      }
      if ((options_->features.code_metadata_enabled() &&
           cur.text().find("metadata.code.") == 0) ||
          cur.text() == "custom") {
        tokens_.push_back(cur);
        continue;
      }
      int indent = 1;
      while (indent > 0) {
        cur = lexer_->GetToken();
        switch (cur.token_type()) {
          case TokenType::Lpar:
          case TokenType::LparAnn:
            indent++;
            break;

          case TokenType::Rpar:
            indent--;
            break;

          case TokenType::Eof:
            indent = 0;
            Error(cur.loc, "unterminated annotation");
            break;

          default:
            break;
        }
      }
    }
  }
  return tokens_.at(n).token_type();
}